

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmanonfn.h
# Opt level: O1

void __thiscall CVmMetaclassAnonFn::create_for_restore(CVmMetaclassAnonFn *this,vm_obj_id_t id)

{
  undefined8 *puVar1;
  
  puVar1 = (undefined8 *)CVmObject::operator_new(0x10,id);
  puVar1[1] = 0;
  *puVar1 = &PTR_get_metaclass_reg_00324cb8;
  *(ushort *)&G_obj_table_X.pages_[id >> 0xc][id & 0xfff].field_0x14 =
       (ushort)*(undefined4 *)&G_obj_table_X.pages_[id >> 0xc][id & 0xfff].field_0x14 & 63999 |
       0x200;
  return;
}

Assistant:

void create_for_restore(VMG_ vm_obj_id_t id)
    {
        new (vmg_ id) CVmObjAnonFn();
        G_obj_table->set_obj_gc_characteristics(id, TRUE, FALSE);
    }